

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

void __thiscall
cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
          (stack_type<std::function<bool(void*)>,std::allocator> *this,function<bool_(void_*)> *args
          )

{
  undefined8 *puVar1;
  undefined8 uVar2;
  error *this_00;
  string local_38;
  
  puVar1 = *(undefined8 **)(this + 8);
  if ((long)puVar1 - *(long *)this >> 5 != *(long *)(this + 0x20)) {
    *(undefined8 **)(this + 8) = puVar1 + 4;
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = args->_M_invoker;
    if ((args->super__Function_base)._M_manager != (_Manager_type)0x0) {
      uVar2 = *(undefined8 *)((long)&(args->super__Function_base)._M_functor + 8);
      *puVar1 = *(undefined8 *)&(args->super__Function_base)._M_functor;
      puVar1[1] = uVar2;
      puVar1[2] = (args->super__Function_base)._M_manager;
      (args->super__Function_base)._M_manager = (_Manager_type)0x0;
      args->_M_invoker = (_Invoker_type)0x0;
    }
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000I","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline bool full() const
		{
			return m_current - m_start == m_size;
		}